

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction_const>>
               (DataStream *s,ParamsWrapper<TransactionSerParams,_const_CMutableTransaction> *args)

{
  long in_FS_OFFSET;
  SizeComputer sizecomp;
  SizeComputer local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.nSize = 0;
  ParamsWrapper<TransactionSerParams,_const_CMutableTransaction>::Serialize<SizeComputer>
            (args,&local_28);
  WriteCompactSize<DataStream>(s,local_28.nSize);
  ParamsWrapper<TransactionSerParams,_const_CMutableTransaction>::Serialize<DataStream>(args,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}